

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

int fits_in_region(double X,double Y,SAORegion *Rgn)

{
  shapeType sVar1;
  double *pdVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  RgnShape *pRVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar31;
  double dVar32;
  double dVar33;
  
  pRVar18 = Rgn->Shapes;
  iVar17 = pRVar18->comp;
  iVar13 = 0;
  bVar20 = false;
  uVar11 = 0;
  do {
    if (Rgn->nShapes <= iVar13) {
      return (int)(bVar20 || uVar11 != 0);
    }
    if ((iVar13 == 0) || (pRVar18->comp != iVar17)) {
      bVar20 = bVar20 || uVar11 != 0;
      uVar11 = (uint)(pRVar18->sign == '\0');
      iVar17 = pRVar18->comp;
    }
    if (uVar11 == 0) {
      if (pRVar18->sign != '\0') goto LAB_001bd36e;
      uVar11 = 0;
      goto LAB_001bdd0d;
    }
    uVar11 = 1;
    if (pRVar18->sign != '\0') goto LAB_001bdd0d;
LAB_001bd36e:
    sVar1 = pRVar18->shape;
    uVar8 = 1;
    uVar11 = uVar8;
    switch(sVar1) {
    case point_rgn:
      dVar33 = X - (pRVar18->param).gen.p[0];
      dVar30 = Y - (pRVar18->param).gen.p[1];
      uVar11 = -(uint)((dVar30 < 0.5 && -0.5 <= dVar30) && (dVar33 < 0.5 && -0.5 <= dVar33));
LAB_001bd92c:
      uVar11 = uVar11 & 1;
      break;
    case line_rgn:
      dVar30 = X - (pRVar18->param).gen.p[0];
      dVar32 = Y - (pRVar18->param).gen.p[1];
      dVar33 = (pRVar18->param).gen.sinT;
      dVar23 = (pRVar18->param).gen.cosT;
      dVar22 = -dVar30 * dVar33 + dVar23 * dVar32;
      dVar30 = dVar30 * dVar23 + dVar33 * dVar32;
      lVar12 = -(ulong)(dVar30 < -0.5);
      auVar6._8_4_ = (int)lVar12;
      auVar6._0_8_ = -(ulong)(dVar22 < -0.5);
      auVar6._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar9 = movmskpd(sVar1,auVar6);
      if ((((0.5 <= dVar22 | (byte)uVar9 | (byte)uVar9 >> 1) & 1) == 0) &&
         (dVar30 < (pRVar18->param).gen.a)) break;
      goto LAB_001bda7f;
    case circle_rgn:
      dVar33 = X - (pRVar18->param).gen.p[0];
      dVar30 = Y - (pRVar18->param).gen.p[1];
      dVar30 = dVar33 * dVar33 + dVar30 * dVar30;
      pdVar2 = &(pRVar18->param).gen.a;
      bVar21 = dVar30 == *pdVar2;
      bVar19 = dVar30 < *pdVar2;
      goto LAB_001bda76;
    case annulus_rgn:
      dVar33 = X - (pRVar18->param).gen.p[0];
      dVar30 = Y - (pRVar18->param).gen.p[1];
      dVar30 = dVar33 * dVar33 + dVar30 * dVar30;
      if (dVar30 < (pRVar18->param).gen.a) goto LAB_001bda7f;
      pdVar2 = &(pRVar18->param).gen.b;
      bVar21 = dVar30 == *pdVar2;
      bVar19 = dVar30 < *pdVar2;
      goto LAB_001bda76;
    case ellipse_rgn:
      dVar22 = X - (pRVar18->param).gen.p[0];
      dVar23 = Y - (pRVar18->param).gen.p[1];
      dVar30 = (pRVar18->param).gen.sinT;
      dVar33 = (pRVar18->param).gen.cosT;
      dVar32 = (dVar22 * dVar33 + dVar23 * dVar30) / (pRVar18->param).gen.p[2];
      dVar30 = (dVar23 * dVar33 - dVar22 * dVar30) / (pRVar18->param).gen.p[3];
      dVar30 = dVar32 * dVar32 + dVar30 * dVar30;
      bVar21 = dVar30 == 1.0;
      bVar19 = dVar30 < 1.0;
      goto LAB_001bda76;
    case elliptannulus_rgn:
      dVar22 = X - (pRVar18->param).gen.p[0];
      dVar23 = Y - (pRVar18->param).gen.p[1];
      dVar30 = (pRVar18->param).gen.sinT;
      dVar33 = (pRVar18->param).gen.cosT;
      dVar32 = (dVar22 * dVar33 + dVar23 * dVar30) / (pRVar18->param).gen.p[4];
      dVar30 = (dVar33 * dVar23 - dVar30 * dVar22) / (pRVar18->param).gen.p[5];
      uVar11 = 0;
      if (dVar32 * dVar32 + dVar30 * dVar30 <= 1.0) {
        dVar30 = (pRVar18->param).gen.a;
        dVar33 = (pRVar18->param).gen.b;
        dVar32 = (dVar22 * dVar33 + dVar23 * dVar30) / (pRVar18->param).gen.p[2];
        dVar30 = (-dVar22 * dVar30 + dVar23 * dVar33) / (pRVar18->param).gen.p[3];
        dVar30 = dVar32 * dVar32 + dVar30 * dVar30;
        bVar21 = dVar30 == 1.0;
        bVar19 = 1.0 < dVar30;
        goto LAB_001bda76;
      }
      break;
    case box_rgn:
      dVar22 = X - (pRVar18->param).gen.p[0];
      dVar30 = Y - (pRVar18->param).gen.p[1];
      dVar33 = (pRVar18->param).gen.sinT;
      dVar23 = (pRVar18->param).gen.cosT;
      dVar32 = dVar22 * dVar23 + dVar30 * dVar33;
      dVar30 = -dVar22 * dVar33 + dVar30 * dVar23;
      dVar33 = (pRVar18->param).gen.p[2] * 0.5;
      dVar23 = (pRVar18->param).gen.p[3] * 0.5;
      bVar21 = dVar32 <= dVar33;
      bVar3 = dVar30 <= dVar23;
      bVar19 = -dVar33 <= dVar32;
      bVar4 = -dVar23 <= dVar30;
      goto LAB_001bdc7f;
    case boxannulus_rgn:
      dVar33 = X - (pRVar18->param).gen.p[0];
      dVar30 = Y - (pRVar18->param).gen.p[1];
      dVar22 = (pRVar18->param).gen.cosT * dVar33 + dVar30 * (pRVar18->param).gen.sinT;
      dVar23 = (pRVar18->param).gen.p[4] * 0.5;
      uVar11 = 0;
      if (((-dVar23 <= dVar22) && (dVar22 <= dVar23)) && (-dVar23 <= dVar22 && dVar22 <= dVar23)) {
        dVar23 = (pRVar18->param).gen.a;
        dVar22 = (pRVar18->param).gen.b;
        dVar32 = dVar33 * dVar22 + dVar30 * dVar23;
        dVar30 = -dVar33 * dVar23 + dVar30 * dVar22;
        dVar33 = (pRVar18->param).gen.p[2] * 0.5;
        dVar23 = (pRVar18->param).gen.p[3] * 0.5;
        lVar12 = -(ulong)(dVar30 < -dVar23);
        auVar28._8_8_ = -(ulong)(dVar23 < dVar30);
        auVar28._0_8_ = -(ulong)(dVar33 < dVar32);
        auVar5._8_4_ = (int)lVar12;
        auVar5._0_8_ = -(ulong)(dVar32 < -dVar33);
        auVar5._12_4_ = (int)((ulong)lVar12 >> 0x20);
        uVar11 = (uint)(byte)(SUB161(auVar28 | auVar5,8) |
                             (byte)-(ulong)(dVar32 < -dVar33) | dVar33 < dVar32);
        goto LAB_001bd92c;
      }
      break;
    case rectangle_rgn:
      dVar24 = X - (pRVar18->param).gen.p[5];
      dVar30 = Y - (pRVar18->param).gen.p[6];
      dVar33 = (pRVar18->param).gen.sinT;
      dVar23 = (pRVar18->param).gen.cosT;
      dVar22 = (pRVar18->param).gen.a;
      dVar32 = (pRVar18->param).gen.b;
      dVar25 = dVar24 * dVar23 + dVar30 * dVar33;
      dVar30 = -dVar24 * dVar33 + dVar30 * dVar23;
      bVar21 = dVar25 <= dVar22;
      bVar3 = dVar30 <= dVar32;
      bVar19 = -dVar22 <= dVar25;
      bVar4 = -dVar32 <= dVar30;
LAB_001bdc7f:
      auVar29._0_8_ = (-(ulong)bVar19 & -(ulong)bVar21) << 0x3f;
      auVar29._8_8_ = (-(ulong)bVar4 & -(ulong)bVar3) << 0x3f;
      iVar10 = movmskpd(sVar1,auVar29);
      uVar11 = (uint)(iVar10 == 3);
      break;
    case diamond_rgn:
      dVar22 = X - (pRVar18->param).gen.p[0];
      dVar30 = Y - (pRVar18->param).gen.p[1];
      dVar33 = (pRVar18->param).gen.sinT;
      dVar23 = (pRVar18->param).gen.cosT;
      auVar26._0_8_ = dVar22 * dVar23 + dVar30 * dVar33;
      auVar26._8_8_ = -dVar22 * dVar33 + dVar30 * dVar23;
      auVar7._8_8_ = (pRVar18->param).gen.p[3] * 0.5;
      auVar7._0_8_ = (pRVar18->param).gen.p[2] * 0.5;
      auVar27 = divpd(auVar26,auVar7);
      dVar30 = ABS(auVar27._8_8_) + ABS(auVar27._0_8_);
      bVar21 = dVar30 == 1.0;
      bVar19 = dVar30 < 1.0;
LAB_001bda76:
      uVar11 = uVar8;
      if (!bVar19 && !bVar21) {
LAB_001bda7f:
        uVar11 = 0;
      }
      break;
    case sector_rgn:
      dVar30 = X - (pRVar18->param).gen.p[0];
      dVar22 = Y - (pRVar18->param).gen.p[1];
LAB_001bdbbf:
      if ((((dVar30 != 0.0) || (NAN(dVar30))) || (dVar22 != 0.0)) || (uVar11 = uVar8, NAN(dVar22)))
      {
LAB_001bdbd8:
        dVar30 = atan2(dVar22,dVar30);
        dVar23 = (dVar30 * 180.0) / 3.141592653589793;
        dVar30 = (pRVar18->param).gen.p[2];
        dVar33 = (pRVar18->param).gen.p[3];
        if (dVar30 <= dVar33) {
          bVar21 = dVar23 <= dVar33 && dVar30 <= dVar23;
        }
        else {
          bVar21 = dVar30 <= dVar23 || dVar23 <= dVar33;
        }
        uVar11 = -(uint)bVar21 & 1;
      }
      break;
    case poly_rgn:
      uVar11 = 0;
      if ((pRVar18->xmin <= X) &&
         (((X < pRVar18->xmax || X == pRVar18->xmax && (pRVar18->ymin <= Y)) &&
          (Y < pRVar18->ymax || Y == pRVar18->ymax)))) {
        lVar12 = (long)(pRVar18->param).poly.nPts;
        pdVar2 = (pRVar18->param).poly.Pts;
        uVar9 = SUB84(pdVar2[lVar12 + -1],0);
        uVar31 = (undefined4)((ulong)pdVar2[lVar12 + -1] >> 0x20);
        uVar15 = 0;
        dVar30 = pdVar2[lVar12 + -2];
        for (uVar14 = 0; uVar11 = uVar15, (long)uVar14 < lVar12; uVar14 = uVar14 + 2) {
          dVar22 = (double)CONCAT44(uVar31,uVar9);
          dVar33 = pdVar2[uVar14];
          dVar23 = pdVar2[uVar14 + 1];
          uVar9 = SUB84(dVar23,0);
          uVar31 = (undefined4)((ulong)dVar23 >> 0x20);
          if ((((Y <= dVar22) || (Y < dVar23)) && ((dVar22 <= Y || (dVar23 < Y)))) &&
             ((X <= dVar30 || (X < dVar33)))) {
            if ((dVar30 <= X) || (dVar33 < X)) {
              if (1e-10 <= ABS(dVar23 - dVar22)) {
                dVar30 = (((dVar33 - dVar30) / (dVar23 - dVar22)) * (Y - dVar22) + dVar30) - X;
                if (-1e-10 <= dVar30) {
                  uVar11 = uVar8;
                  if (1e-10 <= dVar30) goto LAB_001bd583;
                  break;
                }
              }
              else {
                uVar11 = uVar8;
                if (ABS(Y - dVar22) < 1e-10) break;
              }
            }
            else {
LAB_001bd583:
              if ((dVar22 != Y) || (NAN(dVar22) || NAN(Y))) {
                uVar15 = 1 - uVar15;
              }
              else {
                uVar16 = uVar14 | 1;
                do {
                  iVar10 = (int)uVar16;
                  uVar16 = (ulong)(iVar10 - 2);
                  if (iVar10 < 2) {
                    uVar16 = lVar12 - 1U & 0xffffffff;
                  }
                  dVar30 = pdVar2[(int)uVar16];
                } while ((dVar30 == Y) && (!NAN(dVar30) && !NAN(Y)));
                if (0.0 < (Y - dVar30) * (dVar23 - Y)) {
                  uVar15 = 1 - uVar15;
                }
              }
            }
          }
          dVar30 = dVar33;
        }
      }
      break;
    case panda_rgn:
      dVar30 = X - (pRVar18->param).gen.p[0];
      dVar22 = Y - (pRVar18->param).gen.p[1];
      dVar33 = dVar30 * dVar30 + dVar22 * dVar22;
      uVar11 = 0;
      if (((pRVar18->param).gen.a <= dVar33) &&
         (pdVar2 = &(pRVar18->param).gen.b, dVar33 < *pdVar2 || dVar33 == *pdVar2))
      goto LAB_001bdbbf;
      break;
    case epanda_rgn:
      dVar30 = X - (pRVar18->param).gen.p[0];
      dVar32 = Y - (pRVar18->param).gen.p[1];
      dVar33 = (pRVar18->param).gen.sinT;
      dVar23 = (pRVar18->param).gen.cosT;
      dVar22 = -dVar30 * dVar33 + dVar23 * dVar32;
      dVar30 = dVar30 * dVar23 + dVar33 * dVar32;
      dVar33 = dVar30 / (pRVar18->param).gen.p[7];
      dVar23 = dVar22 / (pRVar18->param).gen.p[8];
      uVar11 = 0;
      if ((dVar33 * dVar33 + dVar23 * dVar23 <= 1.0) &&
         (dVar33 = dVar30 / (pRVar18->param).gen.p[5], dVar23 = dVar22 / (pRVar18->param).gen.p[6],
         1.0 <= dVar33 * dVar33 + dVar23 * dVar23)) {
LAB_001bdb26:
        auVar27._8_8_ = -(ulong)(dVar30 != 0.0);
        auVar27._0_8_ = -(ulong)(dVar22 != 0.0);
        iVar10 = movmskpd(sVar1,auVar27);
        uVar11 = uVar8;
        if (iVar10 == 0) break;
        goto LAB_001bdbd8;
      }
      break;
    case bpanda_rgn:
      dVar30 = X - (pRVar18->param).gen.p[0];
      dVar32 = Y - (pRVar18->param).gen.p[1];
      dVar33 = (pRVar18->param).gen.sinT;
      dVar23 = (pRVar18->param).gen.cosT;
      dVar22 = -dVar30 * dVar33 + dVar23 * dVar32;
      dVar30 = dVar30 * dVar23 + dVar33 * dVar32;
      dVar33 = (pRVar18->param).gen.p[7] * 0.5;
      uVar15 = 0;
      uVar11 = 0;
      if (((((-dVar33 <= dVar30) && (dVar30 <= dVar33)) &&
           (dVar33 = (pRVar18->param).gen.p[8] * 0.5, uVar11 = uVar15, -dVar33 <= dVar22)) &&
          (dVar22 <= dVar33)) &&
         (((dVar33 = (pRVar18->param).gen.p[5] * 0.5, dVar30 < -dVar33 || (dVar33 < dVar30)) ||
          ((dVar33 = (pRVar18->param).gen.p[6] * 0.5, dVar22 < -dVar33 || (dVar33 < dVar22))))))
      goto LAB_001bdb26;
    }
    uVar11 = pRVar18->sign == '\0' ^ uVar11;
LAB_001bdd0d:
    iVar13 = iVar13 + 1;
    pRVar18 = pRVar18 + 1;
  } while( true );
}

Assistant:

int fits_in_region( double    X,
            double    Y,
            SAORegion *Rgn )
/*  Test if the given point is within the region described by Rgn.  X and    */
/*  Y are in pixel coordinates.                                              */
/*---------------------------------------------------------------------------*/
{
   double x, y, dx, dy, xprime, yprime, r, th;
   RgnShape *Shapes;
   int i, cur_comp;
   int result, comp_result;

   Shapes = Rgn->Shapes;

   result = 0;
   comp_result = 0;
   cur_comp = Rgn->Shapes[0].comp;

   for( i=0; i<Rgn->nShapes; i++, Shapes++ ) {

     /* if this region has a different component number to the last one  */
     /*	then replace the accumulated selection logical with the union of */
     /*	the current logical and the total logical. Reinitialize the      */
     /* temporary logical.                                               */

     if ( i==0 || Shapes->comp != cur_comp ) {
       result = result || comp_result;
       cur_comp = Shapes->comp;
       /* if an excluded region is given first, then implicitly   */
       /* assume a previous shape that includes the entire image. */
       comp_result = !Shapes->sign;
     }

    /* only need to test if  */
    /*   the point is not already included and this is an include region, */
    /* or the point is included and this is an excluded region */

    if ( (!comp_result && Shapes->sign) || (comp_result && !Shapes->sign) ) { 

      comp_result = 1;

      switch( Shapes->shape ) {

      case box_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[2];
         dy = 0.5 * Shapes->param.gen.p[3];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
            comp_result = 0;
         break;

      case boxannulus_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[4];
         dy = 0.5 * Shapes->param.gen.p[5];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) ) {
	   comp_result = 0;
	 } else {
	   /* Repeat test for inner box */
	   x =  xprime * Shapes->param.gen.b + yprime * Shapes->param.gen.a;
	   y = -xprime * Shapes->param.gen.a + yprime * Shapes->param.gen.b;
	   
	   dx = 0.5 * Shapes->param.gen.p[2];
	   dy = 0.5 * Shapes->param.gen.p[3];
	   if( (x >= -dx) && (x <= dx) && (y >= -dy) && (y <= dy) )
	     comp_result = 0;
	 }
         break;

      case rectangle_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[5];
         yprime = Y - Shapes->param.gen.p[6];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = Shapes->param.gen.a;
         dy = Shapes->param.gen.b;
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
            comp_result = 0;
         break;

      case diamond_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[2];
         dy = 0.5 * Shapes->param.gen.p[3];
         r  = fabs(x/dx) + fabs(y/dy);
         if( r > 1 )
            comp_result = 0;
         break;

      case circle_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r  = x*x + y*y;
         if ( r > Shapes->param.gen.a )
            comp_result = 0;
         break;

      case annulus_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r = x*x + y*y;
         if ( r < Shapes->param.gen.a || r > Shapes->param.gen.b )
            comp_result = 0;
         break;

      case sector_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         if( x || y ) {
            r = atan2( y, x ) * RadToDeg;
            if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
               if( r < Shapes->param.gen.p[2] || r > Shapes->param.gen.p[3] )
                  comp_result = 0;
            } else {
               if( r < Shapes->param.gen.p[2] && r > Shapes->param.gen.p[3] )
                  comp_result = 0;
            }
         }
         break;

      case ellipse_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         x /= Shapes->param.gen.p[2];
         y /= Shapes->param.gen.p[3];
         r = x*x + y*y;
         if( r>1.0 )
            comp_result = 0;
         break;

      case elliptannulus_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to outer ellipse's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         x /= Shapes->param.gen.p[4];
         y /= Shapes->param.gen.p[5];
         r = x*x + y*y;
         if( r>1.0 )
            comp_result = 0;
         else {
            /*  Repeat test for inner ellipse  */
            x =  xprime * Shapes->param.gen.b + yprime * Shapes->param.gen.a;
            y = -xprime * Shapes->param.gen.a + yprime * Shapes->param.gen.b;

            x /= Shapes->param.gen.p[2];
            y /= Shapes->param.gen.p[3];
            r = x*x + y*y;
            if( r<1.0 )
               comp_result = 0;
         }
         break;

      case line_rgn:
         /*  Shift origin to first point of line  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to line's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         if( (y < -0.5) || (y >= 0.5) || (x < -0.5)
             || (x >= Shapes->param.gen.a) )
            comp_result = 0;
         break;

      case point_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         if ( (x<-0.5) || (x>=0.5) || (y<-0.5) || (y>=0.5) )
            comp_result = 0;
         break;

      case poly_rgn:
         if( X<Shapes->xmin || X>Shapes->xmax
             || Y<Shapes->ymin || Y>Shapes->ymax )
            comp_result = 0;
         else
            comp_result = Pt_in_Poly( X, Y, Shapes->param.poly.nPts,
                                       Shapes->param.poly.Pts );
         break;

      case panda_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r = x*x + y*y;
         if ( r < Shapes->param.gen.a || r > Shapes->param.gen.b ) {
	   comp_result = 0;
	 } else {
	   if( x || y ) {
	     th = atan2( y, x ) * RadToDeg;
	     if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
               if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		 comp_result = 0;
	     } else {
               if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		 comp_result = 0;
	     }
	   }
         }
         break;

      case epanda_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;
	 xprime = x;
	 yprime = y;

	 /* outer region test */
         x = xprime/Shapes->param.gen.p[7];
         y = yprime/Shapes->param.gen.p[8];
         r = x*x + y*y;
	 if ( r>1.0 )
	   comp_result = 0;
	 else {
	   /* inner region test */
	   x = xprime/Shapes->param.gen.p[5];
	   y = yprime/Shapes->param.gen.p[6];
	   r = x*x + y*y;
	   if ( r<1.0 )
	     comp_result = 0;
	   else {
	     /* angle test */
	     if( xprime || yprime ) {
	       th = atan2( yprime, xprime ) * RadToDeg;
	       if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
		 if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       } else {
		 if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       }
	     }
	   }
	 }
         break;

      case bpanda_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

	 /* outer box test */
         dx = 0.5 * Shapes->param.gen.p[7];
         dy = 0.5 * Shapes->param.gen.p[8];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
	   comp_result = 0;
	 else {
	   /* inner box test */
	   dx = 0.5 * Shapes->param.gen.p[5];
	   dy = 0.5 * Shapes->param.gen.p[6];
	   if( (x >= -dx) && (x <= dx) && (y >= -dy) && (y <= dy) )
	     comp_result = 0;
	   else {
	     /* angle test */
	     if( x || y ) {
	       th = atan2( y, x ) * RadToDeg;
	       if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
		 if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       } else {
		 if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       }
	     }
	   }
	 }
         break;
      }

      if( !Shapes->sign ) comp_result = !comp_result;

     } 

   }

   result = result || comp_result;
   
   return( result );
}